

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O0

hFILE * hdopen(int fd,char *mode)

{
  size_t capacity;
  char *pcVar1;
  hFILE_fd *fp;
  char *mode_local;
  hFILE *phStack_10;
  int fd_local;
  
  capacity = blksize(fd);
  phStack_10 = hfile_init(0x40,mode,capacity);
  if (phStack_10 == (hFILE *)0x0) {
    phStack_10 = (hFILE *)0x0;
  }
  else {
    *(int *)&phStack_10[1].buffer = fd;
    pcVar1 = strchr(mode,0x73);
    *(byte *)((long)&phStack_10[1].buffer + 4) =
         *(byte *)((long)&phStack_10[1].buffer + 4) & 0xfe | pcVar1 != (char *)0x0;
    phStack_10->backend = &fd_backend;
  }
  return phStack_10;
}

Assistant:

hFILE *hdopen(int fd, const char *mode)
{
    hFILE_fd *fp = (hFILE_fd*) hfile_init(sizeof (hFILE_fd), mode, blksize(fd));
    if (fp == NULL) return NULL;

    fp->fd = fd;
    fp->is_socket = (strchr(mode, 's') != NULL);
    fp->base.backend = &fd_backend;
    return &fp->base;
}